

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

char * kj::_::
       fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
                 (char *target,ArrayPtr<const_char> *first,ArrayPtr<const_char> *rest,
                 ArrayPtr<const_char> *rest_1,FixedArray<char,_1UL> *rest_2,
                 ArrayPtr<const_char> *rest_3,FixedArray<char,_1UL> *rest_4)

{
  size_t sVar1;
  char *__dest;
  
  sVar1 = first->size_;
  if (sVar1 != 0) {
    memcpy(target,first->ptr,sVar1);
    target = target + sVar1;
  }
  sVar1 = rest->size_;
  if (sVar1 != 0) {
    memcpy(target,rest->ptr,sVar1);
    target = target + sVar1;
  }
  sVar1 = rest_1->size_;
  if (sVar1 != 0) {
    memcpy(target,rest_1->ptr,sVar1);
    target = target + sVar1;
  }
  *target = rest_2->content[0];
  __dest = target + 1;
  sVar1 = rest_3->size_;
  if (sVar1 != 0) {
    memcpy(__dest,rest_3->ptr,sVar1);
    __dest = __dest + sVar1;
  }
  *__dest = rest_4->content[0];
  return __dest + 1;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}